

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdDecomposeSingleVar(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int local_34;
  int v;
  abctime clk;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  aVar2 = Abc_Clock();
  clk._4_4_ = nVars;
  if (nVars < 2) {
    __assert_fail("nVars > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x611,"int Dau_DsdDecomposeSingleVar(Dau_Dsd_t *, word *, int *, int)");
  }
LAB_00635952:
  do {
    local_34 = nVars + -1;
    if (-1 < local_34 && 1 < clk._4_4_) {
      iVar1 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,clk._4_4_,local_34);
      nVars = local_34;
      if (iVar1 == 0) goto LAB_00635952;
      clk._4_4_ = clk._4_4_ + -1;
    }
    if ((local_34 == -1) || (nVars = clk._4_4_, clk._4_4_ == 1)) {
      if (clk._4_4_ == 1) {
        clk._4_4_ = 0;
        Dau_DsdWriteVar(p,*pVars,(uint)*pTruth & 1);
      }
      aVar3 = Abc_Clock();
      s_Times[0] = (aVar3 - aVar2) + s_Times[0];
      return clk._4_4_;
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeSingleVar( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    assert( nVars > 1 );
    while ( 1 )
    {
        int v;
        for ( v = nVars - 1; v >= 0 && nVars > 1; v-- )
            if ( Dau_DsdDecomposeSingleVarOne( p, pTruth, pVars, nVars, v ) )
            {
                nVars--;
                break;
            }
        if ( v == -1 || nVars == 1 )
            break;
    }
    if ( nVars == 1 )
        Dau_DsdWriteVar( p, pVars[--nVars], (int)(pTruth[0] & 1) );
    s_Times[0] += Abc_Clock() - clk;
    return nVars;
}